

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

void std::pmr::formatBlock(void *address,size_t length)

{
  byte *pbVar1;
  int i;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  
  uVar2 = 0;
  pbVar3 = (byte *)address;
  while (pbVar3 < (byte *)(length + (long)address)) {
    if ((uVar2 & 3) == 0) {
      if (uVar2 != 0) {
        putchar(10);
      }
      printf("%p:\t",pbVar3);
    }
    else {
      printf("  ");
    }
    for (lVar4 = 0;
        (pbVar1 = pbVar3 + lVar4, (uint)lVar4 < 4 && (pbVar1 < (byte *)(length + (long)address)));
        lVar4 = lVar4 + 1) {
      printf("%02x ",(ulong)*pbVar1);
    }
    uVar2 = uVar2 + 1;
    pbVar3 = pbVar1;
  }
  putchar(10);
  return;
}

Assistant:

static
void formatBlock(void *address, std::size_t length)
    // Format in hex to 'stdout', a block of memory starting at the specified
    // starting 'address' of the specified 'length' (in bytes).  Each line of
    // formatted output will have a maximum of 16 bytes per line, where each
    // line starts with the address of that 16-byte chunk.
{
    byte *addr    = reinterpret_cast<byte *>(address);
    byte *endAddr = addr + length;

    for (int i = 0; addr < endAddr; ++i) {
        if (0 == i % 4) {
            if (i) {
                printf("\n");
            }
            printf("%p:\t", static_cast<void *>(addr));
        }
        else {
            printf("  ");
        }

        for (int j = 0; j < 4 && addr < endAddr; ++j) {
            printf("%02x ", *addr);
            ++addr;
        }
    }

    printf("\n");
}